

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::CmpHelperEQ<double,int>
          (internal *this,char *expected_expression,char *actual_expression,double *expected,
          int *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar2;
  String local_48;
  String local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  
  if ((*expected != (double)*actual) || (NAN(*expected) || NAN((double)*actual))) {
    FormatForComparisonFailureMessage<double,int>((double *)&local_38,(int *)expected);
    FormatForComparisonFailureMessage<int,double>((int *)&local_48,(double *)actual);
    AVar2 = EqFailure(this,expected_expression,actual_expression,&local_38,&local_48,false);
    sVar1 = AVar2.message_.ptr_;
    if (local_48.c_str_ != (char *)0x0) {
      operator_delete__(local_48.c_str_);
      sVar1.ptr_ = extraout_RDX;
    }
    if (local_38.c_str_ != (char *)0x0) {
      operator_delete__(local_38.c_str_);
      sVar1.ptr_ = extraout_RDX_00;
    }
  }
  else {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}